

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::GetActionHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ahI,Index t,Index *aIs)

{
  undefined1 auVar1 [16];
  Index IVar2;
  int iVar3;
  int iVar4;
  const_reference this_00;
  const_reference pvVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var_00 [56];
  
  auVar9 = in_ZMM0._0_16_;
  this_00 = std::
            vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ::at(&this->_m_firstAHIforT,(ulong)agentI);
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (this_00,(ulong)t);
  IVar2 = Globals::CastLIndexToIndex(*pvVar5);
  uVar8 = ahI - IVar2;
  iVar3 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
  auVar9 = vcvtusi2sd_avx512f(auVar9,CONCAT44(extraout_var,iVar3));
  iVar3 = t - 1;
  for (lVar7 = 0; (ulong)t << 2 != lVar7; lVar7 = lVar7 + 4) {
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,iVar3);
    auVar10._0_8_ = pow(auVar9._0_8_,auVar1._0_8_);
    auVar10._8_56_ = extraout_var_00;
    uVar6 = vcvttsd2usi_avx512f(auVar10._0_16_);
    iVar3 = iVar3 + -1;
    iVar4 = (int)(uVar8 / uVar6);
    *(int *)((long)aIs + lVar7) = iVar4;
    uVar8 = uVar8 - (int)uVar6 * iVar4;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetActionHistoryArrays
    (Index agentI, Index ahI, Index t,  Index aIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //action-histories.
    Index ahIwithinThisT = ahI - CastLIndexToIndex(_m_firstAHIforT.at(agentI).at(t));
   
    Index remainder = ahIwithinThisT;
    size_t vec_size = t; // the number of joint actions we are searching
    size_t nrA = GetNrActions(agentI);
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionActionHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrA, (double)(stage));
        Index aI_t2 = remainder / b;
        aIs[t2] = aI_t2; 
        remainder -= aI_t2 * b;
    }
}